

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Value::isInt(Value *this)

{
  char cVar1;
  double *in_RDI;
  bool local_22;
  bool local_21;
  bool local_1;
  
  cVar1 = *(char *)(in_RDI + 1);
  if (cVar1 == '\x01') {
    local_21 = false;
    if (-0x80000001 < (long)*in_RDI) {
      local_21 = (long)*in_RDI < 0x80000000;
    }
    local_1 = local_21;
  }
  else if (cVar1 == '\x02') {
    local_1 = (ulong)*in_RDI < 0x80000000;
  }
  else if (cVar1 == '\x03') {
    local_22 = false;
    if ((-2147483648.0 <= *in_RDI) && (local_22 = false, *in_RDI <= 2147483647.0)) {
      local_22 = IsIntegral((double)in_RDI);
    }
    local_1 = local_22;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Value::isInt() const {
  switch (type_) {
  case intValue:
    return value_.int_ >= minInt && value_.int_ <= maxInt;
  case uintValue:
    return value_.uint_ <= UInt(maxInt);
  case realValue:
    return value_.real_ >= minInt && value_.real_ <= maxInt &&
           IsIntegral(value_.real_);
  default:
    break;
  }
  return false;
}